

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.H
# Opt level: O3

Array4<double> * __thiscall
amrex::MLLinOp::compactify<double>
          (Array4<double> *__return_storage_ptr__,MLLinOp *this,Array4<double> *a)

{
  int iVar1;
  Long LVar2;
  Long LVar3;
  Long LVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  double *pdVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  
  iVar8 = (this->info).hidden_direction;
  if (iVar8 == 2) {
    pdVar7 = a->p;
    iVar8 = (a->begin).x;
    iVar9 = (a->begin).y;
    iVar10 = (a->end).x;
    iVar11 = (a->end).y;
  }
  else {
    if (iVar8 == 1) {
      pdVar7 = a->p;
      iVar8 = (a->begin).x;
      iVar9 = (a->begin).z;
      iVar10 = (a->end).x;
    }
    else {
      if (iVar8 != 0) {
        pdVar7 = a->p;
        LVar2 = a->jstride;
        LVar3 = a->kstride;
        LVar4 = a->nstride;
        iVar10 = (a->begin).x;
        iVar11 = (a->begin).y;
        uVar5 = *(undefined8 *)&(a->begin).z;
        iVar8 = (a->end).z;
        iVar9 = a->ncomp;
        uVar6 = *(undefined4 *)&a->field_0x3c;
        (__return_storage_ptr__->end).y = (a->end).y;
        (__return_storage_ptr__->end).z = iVar8;
        __return_storage_ptr__->ncomp = iVar9;
        *(undefined4 *)&__return_storage_ptr__->field_0x3c = uVar6;
        (__return_storage_ptr__->begin).x = iVar10;
        (__return_storage_ptr__->begin).y = iVar11;
        *(undefined8 *)&(__return_storage_ptr__->begin).z = uVar5;
        __return_storage_ptr__->kstride = LVar3;
        __return_storage_ptr__->nstride = LVar4;
        __return_storage_ptr__->p = pdVar7;
        __return_storage_ptr__->jstride = LVar2;
        return __return_storage_ptr__;
      }
      pdVar7 = a->p;
      iVar8 = (a->begin).y;
      iVar9 = (a->begin).z;
      iVar10 = (a->end).y;
    }
    iVar11 = (a->end).z;
  }
  iVar1 = a->ncomp;
  __return_storage_ptr__->p = pdVar7;
  __return_storage_ptr__->jstride = (long)(iVar10 - iVar8);
  lVar12 = (long)(iVar11 - iVar9) * (long)(iVar10 - iVar8);
  __return_storage_ptr__->kstride = lVar12;
  __return_storage_ptr__->nstride = lVar12;
  (__return_storage_ptr__->begin).x = iVar8;
  (__return_storage_ptr__->begin).y = iVar9;
  (__return_storage_ptr__->begin).z = 0;
  (__return_storage_ptr__->end).x = iVar10;
  (__return_storage_ptr__->end).y = iVar11;
  (__return_storage_ptr__->end).z = 1;
  __return_storage_ptr__->ncomp = iVar1;
  return __return_storage_ptr__;
}

Assistant:

Array4<T> compactify (Array4<T> const& a) const noexcept
    {
        if (info.hidden_direction == 0) {
            return Array4<T>(a.dataPtr(), {a.begin.y,a.begin.z,0}, {a.end.y,a.end.z,1}, a.nComp());
        } else if (info.hidden_direction == 1) {
            return Array4<T>(a.dataPtr(), {a.begin.x,a.begin.z,0}, {a.end.x,a.end.z,1}, a.nComp());
        } else if (info.hidden_direction == 2) {
            return Array4<T>(a.dataPtr(), {a.begin.x,a.begin.y,0}, {a.end.x,a.end.y,1}, a.nComp());
        } else {
            return a;
        }
    }